

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

int xpath_ceiling(lyxp_set **args,uint16_t UNUSED_arg_count,lyd_node *cur_node,lys_module *param_4,
                 lyxp_set *set,int options)

{
  int iVar1;
  int iVar2;
  longdouble lVar3;
  longdouble lVar4;
  
  iVar1 = lyxp_set_cast(*args,LYXP_SET_NUMBER,cur_node,param_4,options);
  iVar2 = -1;
  if (iVar1 == 0) {
    lVar4 = ((*args)->val).num;
    lVar3 = (longdouble)(long)ROUND(lVar4);
    if ((lVar4 != lVar3) || (NAN(lVar4) || NAN(lVar3))) {
      lVar4 = (longdouble)((long)ROUND(lVar4) + 1);
    }
    if ((set->type | LYXP_SET_NUMBER) == LYXP_SET_STRING) {
      free((set->val).nodes);
    }
    set->type = LYXP_SET_NUMBER;
    (set->val).num = lVar4;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int
xpath_ceiling(struct lyxp_set **args, uint16_t UNUSED(arg_count), struct lyd_node *cur_node, struct lys_module *local_mod,
              struct lyxp_set *set, int options)
{
    if (lyxp_set_cast(args[0], LYXP_SET_NUMBER, cur_node, local_mod, options)) {
        return -1;
    }
    if ((long long)args[0]->val.num != args[0]->val.num) {
        set_fill_number(set, ((long long)args[0]->val.num) + 1);
    } else {
        set_fill_number(set, args[0]->val.num);
    }

    return EXIT_SUCCESS;
}